

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int trsrch(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double *dx,double maxstep
          ,int iter,double *L,double *hess,double stol,double *ioval,double eps,double *x)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  double *sN_00;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a0;
  double funcprev;
  double local_90;
  double local_88;
  double *local_80;
  custom_function *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double local_58;
  double local_50;
  double *local_48;
  double *local_40;
  int local_34;
  
  ioval[7] = 1.0;
  __size = (long)N * 8;
  local_90 = eps;
  local_88 = stol;
  local_80 = xi;
  local_78 = funcpt;
  local_68 = sN;
  local_50 = maxstep;
  local_40 = (double *)malloc(__size);
  local_70 = (double *)malloc(__size);
  local_60 = (double *)malloc(__size);
  sN_00 = local_68;
  local_a0 = 0.0;
  uVar10 = (ulong)(uint)N;
  local_58 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      local_58 = local_58 + dx[uVar3] * local_68[uVar3] * dx[uVar3] * local_68[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar10 != uVar3);
  }
  local_48 = dx;
  local_34 = N;
  if (local_58 < 0.0) {
    local_58 = sqrt(local_58);
  }
  else {
    local_58 = SQRT(local_58);
  }
  iVar1 = local_34;
  if ((iter != 1) && ((*ioval != -1.0 || (NAN(*ioval))))) goto LAB_001268c7;
  ioval[1] = 0.0;
  if (local_34 < 1) {
    dVar11 = l2norm(local_40,local_34);
    dVar11 = dVar11 * dVar11;
LAB_00126898:
    dVar12 = 0.0;
  }
  else {
    uVar3 = 0;
    do {
      local_40[uVar3] = jac[uVar3] / local_48[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar10 != uVar3);
    dVar11 = l2norm(local_40,local_34);
    dVar11 = dVar11 * dVar11;
    if (iVar1 < 1) goto LAB_00126898;
    dVar12 = 0.0;
    uVar4 = 0;
    uVar3 = uVar10;
    pdVar5 = jac;
    pdVar6 = local_48;
    pdVar7 = L;
    do {
      uVar8 = 0;
      dVar13 = 0.0;
      pdVar9 = pdVar7;
      do {
        dVar13 = dVar13 + (*pdVar9 * pdVar5[uVar8]) / (pdVar6[uVar8] * pdVar6[uVar8]);
        pdVar9 = pdVar9 + uVar10;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      dVar12 = dVar12 + dVar13 * dVar13;
      uVar4 = uVar4 + 1;
      pdVar7 = pdVar7 + uVar10 + 1;
      pdVar6 = pdVar6 + 1;
      pdVar5 = pdVar5 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar4 != uVar10);
  }
  dVar12 = (SQRT(dVar11) * dVar11) / dVar12;
  *ioval = dVar12;
  if (local_50 < dVar12) {
    *ioval = local_50;
  }
LAB_001268c7:
  pdVar6 = local_48;
  pdVar5 = local_70;
  dVar11 = 1.97626258336499e-323;
  while ((iVar1 = local_34, uVar2 = SUB84(dVar11,0), 0xf < uVar2 ||
         ((0x8003U >> (uVar2 & 0x1f) & 1) == 0))) {
    funcprev = dVar11;
    trstep(jac,sN_00,local_34,pdVar6,L,hess,local_58,ioval,local_90,pdVar5);
    sN_00 = local_68;
    ioval[2] = *ioval;
    uVar2 = trupdate(local_78,local_80,jac,pdVar5,iVar1,pdVar6,local_50,SUB84(funcprev,0),L,hess,
                     local_88,0,ioval,local_60,&local_a0,x);
    dVar11 = (double)(ulong)uVar2;
  }
  free(local_40);
  free(local_70);
  free(local_60);
  return uVar2;
}

Assistant:

int trsrch(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double * dx,double maxstep,
		int iter,double *L,double *hess,double stol,double *ioval,double eps,double *x) {
	int retval,i,j,method;		
	double alpha,beta;
	double nlen,t1,funcprev;
	double *temp,*step,*xprev;
	/*
	 * ioval[0] = delta; [trust region current radius]
	 * ioval[1] = lambda;
	 * ioval[2] = deltaprev; [trust region previous radius]
	 * ioval[3] = phi;
	 * ioval[4] = phi';
	 * ioval[5] = phi_init';
	 * ioval[5] and ioval[6] are "binary" flags.
	 */ 
	retval = 4;
	nlen = 0.0;
	ioval[7] = 1.0;
	method = 0;
	temp = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	xprev = (double*) malloc(sizeof(double) *N);

	funcprev = 0.0;
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * sN[i] * dx[i] * sN[i];
	}
	nlen = sqrt(nlen);
	if (iter == 1 || ioval[0] == -1) {
		ioval[1] = 0.;
		for (i = 0; i < N;++i) {
			temp[i] = jac[i] / dx[i];
		}
		alpha = l2norm(temp,N);
		alpha = alpha*alpha;
		
		beta = 0;
		for(i = 0; i < N;++i) {
			t1 = 0.;
			for(j = i; j < N;++j) {
				t1+= L[j*N+i]*jac[j]/(dx[j] * dx[j]);
			}
			beta += t1*t1;
		}
		ioval[0] = alpha * sqrt(alpha) / beta;
		
		if (ioval[0] > maxstep) {
			ioval[0] = maxstep;
		}
	}
	
	while (retval >= 2 && retval != 15) {
		trstep(jac,sN,N,dx,L,hess,nlen,ioval,eps,step);
		ioval[2] = ioval[0];
		retval = trupdate(funcpt,xi,jac,step,N,dx,maxstep,retval,L,hess,stol,method,ioval,xprev,&funcprev,x);
	}
	 
	free(temp); 
	free(step);
	free(xprev);
	return retval;

}